

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String __thiscall Bstrlib::String::fromTo(String *this,String *from,String *to,bool includeFind)

{
  undefined7 in_register_00000009;
  uchar *extraout_RDX;
  byte in_R8B;
  String SVar2;
  int local_54;
  int toPos;
  int fromPos;
  bool includeFind_local;
  String *to_local;
  String *from_local;
  String *this_local;
  uchar *puVar1;
  
  local_54 = Find(from,to,0);
  if (local_54 == -1) {
    String(this,"");
    puVar1 = extraout_RDX;
  }
  else {
    Find(from,(String *)CONCAT71(in_register_00000009,includeFind),
         local_54 + (to->super_tagbstring).slen);
    if ((in_R8B & 1) == 0) {
      local_54 = local_54 + (to->super_tagbstring).slen;
    }
    SVar2 = midString(this,(int)from,local_54);
    puVar1 = SVar2.super_tagbstring.data;
  }
  SVar2.super_tagbstring.data = puVar1;
  SVar2.super_tagbstring._0_8_ = this;
  return (String)SVar2.super_tagbstring;
}

Assistant:

const String String::fromTo(const String & from, const String & to, const bool includeFind) const
    {
        const int fromPos = Find(from);
        if (fromPos == -1) return "";
        const int toPos = Find(to, fromPos + from.slen);
        return midString(includeFind ? fromPos : fromPos + from.slen, toPos != -1 ? (includeFind ? toPos + to.slen - fromPos : toPos - fromPos - from.slen)
                                           // If the "to" needle was not found, either we return the whole string (includeFind) or an empty string
                                           : (includeFind ? slen - fromPos : 0));
    }